

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O0

int ipc_listener_set_perms(void *arg,void *buf,size_t sz,nni_type t)

{
  uint local_3c;
  int rv;
  int mode;
  ipc_listener *l;
  size_t sStack_28;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  _rv = arg;
  l._4_4_ = t;
  sStack_28 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  arg_local._4_4_ = nni_copyin_int((int *)&local_3c,buf,sz,0,0xf000,t);
  if (arg_local._4_4_ == 0) {
    if (*(short *)((long)_rv + 0x88) == 5) {
      arg_local._4_4_ = 0;
    }
    else if ((local_3c & 0xf000) == 0) {
      local_3c = local_3c | 0xc000;
      nni_mtx_lock((nni_mtx *)((long)_rv + 0x140));
      if ((*(byte *)((long)_rv + 0x128) & 1) == 0) {
        *(uint *)((long)_rv + 0x138) = local_3c;
        nni_mtx_unlock((nni_mtx *)((long)_rv + 0x140));
        arg_local._4_4_ = 0;
      }
      else {
        nni_mtx_unlock((nni_mtx *)((long)_rv + 0x140));
        arg_local._4_4_ = 4;
      }
    }
    else {
      arg_local._4_4_ = 3;
    }
  }
  return arg_local._4_4_;
}

Assistant:

static int
ipc_listener_set_perms(void *arg, const void *buf, size_t sz, nni_type t)
{
	ipc_listener *l = arg;
	int           mode;
	int           rv;

	if ((rv = nni_copyin_int(&mode, buf, sz, 0, S_IFMT, t)) != 0) {
		return (rv);
	}
	if (l->sa.s_family == NNG_AF_ABSTRACT) {
		// We ignore permissions on abstract sockets.
		// They succeed, but have no effect.
		return (0);
	}
	if ((mode & S_IFMT) != 0) {
		return (NNG_EINVAL);
	}
	mode |= S_IFSOCK; // set IFSOCK to ensure non-zero
	nni_mtx_lock(&l->mtx);
	if (l->started) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_EBUSY);
	}
	l->perms = mode;
	nni_mtx_unlock(&l->mtx);
	return (0);
}